

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               PredictionData<double,_unsigned_long> *prediction_data,double *output_depth,
               unsigned_long *tree_num,double *tree_depth,size_t row)

{
  pointer pIVar1;
  double dVar2;
  bool bVar3;
  pointer pIVar4;
  int *piVar5;
  size_t sVar6;
  pointer pcVar7;
  pointer pcVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  size_t *psVar13;
  long lVar14;
  bool bVar15;
  
  pIVar4 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = prediction_data->categ_data;
  bVar3 = prediction_data->is_col_major;
  lVar14 = prediction_data->ncols_categ * row;
  sVar6 = prediction_data->nrows;
  sVar9 = 0;
  do {
    pIVar1 = pIVar4 + sVar9;
LAB_0013e382:
    do {
      while( true ) {
        if (pIVar4[sVar9].tree_left == 0) {
          dVar2 = pIVar1->score;
          *output_depth = *output_depth + dVar2;
          if (tree_num != (unsigned_long *)0x0) {
            tree_num[row] = sVar9;
          }
          if (tree_depth != (double *)0x0) {
            *tree_depth = dVar2;
          }
          return;
        }
        if (pIVar1->col_type == Categorical) break;
        if (pIVar1->col_type == Numeric) {
          lVar10 = pIVar1->col_num + prediction_data->ncols_numeric * row;
          if ((bVar3 & 1U) != 0) {
            lVar10 = sVar6 * pIVar1->col_num + row;
          }
          bVar15 = pIVar1->num_split < prediction_data->numeric_data[lVar10];
          goto LAB_0013e45d;
        }
      }
      if (model_outputs->cat_split_type == SubSet) {
        pcVar7 = (pIVar1->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar8 = *(pointer *)
                  ((long)&(pIVar1->cat_split).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8)
        ;
        if (pcVar7 == pcVar8) {
          lVar10 = pIVar1->col_num + lVar14;
          if ((bVar3 & 1U) != 0) {
            lVar10 = sVar6 * pIVar1->col_num + row;
          }
          if (piVar5[lVar10] < 2) {
            psVar13 = &pIVar1->tree_right;
            if (piVar5[lVar10] == 0) {
              psVar13 = &pIVar1->tree_left;
            }
            goto LAB_0013e4de;
          }
        }
        else {
          iVar12 = (int)pcVar8;
          if (model_outputs->new_cat_action != Smallest) {
            if (model_outputs->new_cat_action == Random) {
              lVar10 = pIVar1->col_num + lVar14;
              if ((bVar3 & 1U) != 0) {
                lVar10 = sVar6 * pIVar1->col_num + row;
              }
              iVar11 = piVar5[lVar10];
              iVar12 = iVar12 - (int)pcVar7;
              if (iVar12 <= iVar11) {
                iVar11 = iVar11 % iVar12;
              }
              psVar13 = &pIVar1->tree_right;
              if (pcVar7[iVar11] != '\0') {
                psVar13 = &pIVar1->tree_left;
              }
              goto LAB_0013e4de;
            }
            goto LAB_0013e382;
          }
          lVar10 = pIVar1->col_num + lVar14;
          if ((bVar3 & 1U) != 0) {
            lVar10 = sVar6 * pIVar1->col_num + row;
          }
          if (piVar5[lVar10] < iVar12 - (int)pcVar7) {
            psVar13 = &pIVar1->tree_right;
            if (pcVar7[piVar5[lVar10]] != '\0') {
              psVar13 = &pIVar1->tree_left;
            }
            goto LAB_0013e4de;
          }
        }
        psVar13 = &pIVar1->tree_right;
        if (pIVar1->pct_tree_left <= 0.5 && pIVar1->pct_tree_left != 0.5) {
          psVar13 = &pIVar1->tree_left;
        }
        goto LAB_0013e4de;
      }
    } while (model_outputs->cat_split_type != SingleCateg);
    lVar10 = pIVar1->col_num + lVar14;
    if ((bVar3 & 1U) != 0) {
      lVar10 = sVar6 * pIVar1->col_num + row;
    }
    bVar15 = piVar5[lVar10] != pIVar1->chosen_cat;
LAB_0013e45d:
    psVar13 = &pIVar1->tree_left + bVar15;
LAB_0013e4de:
    sVar9 = *psVar13;
  } while( true );
}

Assistant:

void traverse_itree_no_recurse(std::vector<IsoTree>  &tree,
                               IsoForest             &model_outputs,
                               PredictionData        &prediction_data,
                               double &restrict      output_depth,
                               sparse_ix *restrict   tree_num,
                               double *restrict      tree_depth,
                               size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    int    cval;
    while (true)
    {
        // if (tree[curr_lev].score > 0)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            switch (tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    xval =  prediction_data.numeric_data[
                                prediction_data.is_col_major?
                                (row + tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_numeric)
                            ];
                    curr_lev = (xval <= tree[curr_lev].num_split)?
                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    switch (model_outputs.cat_split_type)
                    {
                        case SubSet:
                        {

                            if (tree[curr_lev].cat_split.empty()) /* this is for binary columns */
                            {
                                if (cval <= 1)
                                {
                                    curr_lev = (cval == 0)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }

                                else /* can only work with 'Smallest' + no NAs if reaching this point */
                                {
                                    curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                }
                            }

                            else
                            {

                                switch (model_outputs.new_cat_action)
                                {
                                    case Random:
                                    {
                                        cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                        curr_lev = (tree[curr_lev].cat_split[cval])?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        break;
                                    }

                                    case Smallest:
                                    {
                                        if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                        {
                                            curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }

                                        else
                                        {
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                        }
                                        break;
                                    }

                                    default:
                                    {
                                        assert(0);
                                        break;
                                    }
                                }
                            }
                            break;
                        }

                        case SingleCateg:
                        {
                            curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                            break;
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}